

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O3

void aead_do_encrypt(st_ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq
                    ,void *aad,size_t aadlen,ptls_aead_supplementary_encryption_t *supp)

{
  ptls_fusion_aesgcm_context_t *ctx;
  size_t unaff_RBX;
  ptls_aead_supplementary_encryption_t *unaff_R12;
  undefined1 auVar1 [16];
  __m128i ctr;
  
  ctx = (ptls_fusion_aesgcm_context_t *)_ctx[1].algo;
  if (ctx->capacity < aadlen + inlen) {
    ctx = ptls_fusion_aesgcm_set_capacity(ctx,aadlen + inlen);
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ctx;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = seq;
  vpslldq_avx(auVar1,4);
  ctr[1] = aadlen;
  ctr[0] = (longlong)aad;
  ptls_fusion_aesgcm_encrypt(ctx,output,input,inlen,ctr,supp,unaff_RBX,unaff_R12);
  return;
}

Assistant:

void aead_do_encrypt(struct st_ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                     const void *aad, size_t aadlen, ptls_aead_supplementary_encryption_t *supp)
{
    struct aesgcm_context *ctx = (void *)_ctx;

    if (inlen + aadlen > ctx->aesgcm->capacity)
        ctx->aesgcm = ptls_fusion_aesgcm_set_capacity(ctx->aesgcm, inlen + aadlen);
    ptls_fusion_aesgcm_encrypt(ctx->aesgcm, output, input, inlen, calc_counter(ctx, seq), aad, aadlen, supp);
}